

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

int __thiscall GdlGlyphClassDefn::GlyphIDCount(GdlGlyphClassDefn *this)

{
  pointer ppGVar1;
  int iVar2;
  int iVar3;
  size_t iglfd;
  ulong uVar4;
  
  iVar3 = 0;
  uVar4 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpglfdMembers).
              super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpglfdMembers).
                      super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar4)
    break;
    iVar2 = (*(ppGVar1[uVar4]->super_GdlDefn)._vptr_GdlDefn[5])();
    iVar3 = iVar3 + iVar2;
    uVar4 = uVar4 + 1;
  }
  return iVar3;
}

Assistant:

int GdlGlyphClassDefn::GlyphIDCount()
{
	int c = 0;
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
		 c += m_vpglfdMembers[iglfd]->GlyphIDCount();
	return c;
}